

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

If_Obj_t * If_ManCreateAnd(If_Man_t *p,If_Obj_t *pFan0,If_Obj_t *pFan1)

{
  uint uVar1;
  If_Obj_t *pIVar2;
  If_Obj_t *pIVar3;
  uint local_4c;
  If_Man_t *local_48;
  If_Man_t *local_40;
  If_Obj_t *pObj;
  If_Obj_t *pFan1_local;
  If_Obj_t *pFan0_local;
  If_Man_t *p_local;
  
  p_local = (If_Man_t *)pFan0;
  if (pFan0 != pFan1) {
    pIVar2 = If_Not(pFan1);
    if (pFan0 == pIVar2) {
      p_local = (If_Man_t *)If_Not(p->pConst1);
    }
    else {
      pIVar2 = If_Regular(pFan0);
      if (pIVar2 == p->pConst1) {
        local_40 = (If_Man_t *)pFan1;
        if (pFan0 != p->pConst1) {
          local_40 = (If_Man_t *)If_Not(p->pConst1);
        }
        p_local = local_40;
      }
      else {
        pIVar2 = If_Regular(pFan1);
        if (pIVar2 == p->pConst1) {
          local_48 = (If_Man_t *)pFan0;
          if (pFan1 != p->pConst1) {
            local_48 = (If_Man_t *)If_Not(p->pConst1);
          }
          p_local = local_48;
        }
        else {
          p_local = (If_Man_t *)If_ManSetupObj(p);
          *(uint *)&p_local->pName = *(uint *)&p_local->pName & 0xfffffff0 | 4;
          uVar1 = If_IsComplement(pFan0);
          *(uint *)&p_local->pName = *(uint *)&p_local->pName & 0xffffffef | (uVar1 & 1) << 4;
          pIVar2 = If_Regular(pFan0);
          uVar1 = If_IsComplement(pFan1);
          *(uint *)&p_local->pName = *(uint *)&p_local->pName & 0xffffffdf | (uVar1 & 1) << 5;
          pIVar3 = If_Regular(pFan1);
          p_local->vCis = (Vec_Ptr_t *)pIVar2;
          pIVar2->nRefs = pIVar2->nRefs + 1;
          pIVar2->nVisits = pIVar2->nVisits + 1;
          pIVar2->nVisitsCopy = pIVar2->nVisitsCopy + 1;
          p_local->vCos = (Vec_Ptr_t *)pIVar3;
          pIVar3->nRefs = pIVar3->nRefs + 1;
          pIVar3->nVisits = pIVar3->nVisits + 1;
          pIVar3->nVisitsCopy = pIVar3->nVisitsCopy + 1;
          *(uint *)&p_local->pName =
               *(uint *)&p_local->pName & 0xffffffbf |
               ((*(uint *)&p_local->pName >> 4 & 1 ^ *(uint *)pIVar2 >> 6 & 1) &
               (*(uint *)&p_local->pName >> 5 & 1 ^ *(uint *)pIVar3 >> 6 & 1)) << 6;
          if (*(uint *)pIVar3 >> 0xd < *(uint *)pIVar2 >> 0xd) {
            local_4c = *(uint *)pIVar2;
          }
          else {
            local_4c = *(uint *)pIVar3;
          }
          local_4c = local_4c >> 0xd;
          *(uint *)&p_local->pName = *(uint *)&p_local->pName & 0x1fff | (local_4c + 1) * 0x2000;
          if (p->nLevelMax < (int)(*(uint *)&p_local->pName >> 0xd)) {
            p->nLevelMax = *(uint *)&p_local->pName >> 0xd;
          }
          p->nObjs[4] = p->nObjs[4] + 1;
        }
      }
    }
  }
  return (If_Obj_t *)p_local;
}

Assistant:

If_Obj_t * If_ManCreateAnd( If_Man_t * p, If_Obj_t * pFan0, If_Obj_t * pFan1 )
{
    If_Obj_t * pObj;
    // perform constant propagation
    if ( pFan0 == pFan1 )
        return pFan0;
    if ( pFan0 == If_Not(pFan1) )
        return If_Not(p->pConst1);
    if ( If_Regular(pFan0) == p->pConst1 )
        return pFan0 == p->pConst1 ? pFan1 : If_Not(p->pConst1);
    if ( If_Regular(pFan1) == p->pConst1 )
        return pFan1 == p->pConst1 ? pFan0 : If_Not(p->pConst1);
    // get memory for the new object
    pObj = If_ManSetupObj( p );
    pObj->Type    = IF_AND;
    pObj->fCompl0 = If_IsComplement(pFan0); pFan0 = If_Regular(pFan0);
    pObj->fCompl1 = If_IsComplement(pFan1); pFan1 = If_Regular(pFan1);
    pObj->pFanin0 = pFan0; pFan0->nRefs++; pFan0->nVisits++; pFan0->nVisitsCopy++;
    pObj->pFanin1 = pFan1; pFan1->nRefs++; pFan1->nVisits++; pFan1->nVisitsCopy++;
    pObj->fPhase  = (pObj->fCompl0 ^ pFan0->fPhase) & (pObj->fCompl1 ^ pFan1->fPhase);
    pObj->Level   = 1 + IF_MAX( pFan0->Level, pFan1->Level );
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nObjs[IF_AND]++;
    return pObj;
}